

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::Mse16xHTest_RefMse_Test::TestBody(Mse16xHTest_RefMse_Test *this)

{
  ACMRandom *this_00;
  int dstride;
  int h;
  undefined8 *puVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int iVar4;
  ushort uVar5;
  pointer *__ptr;
  SEARCH_METHODS *message;
  int k;
  long lVar6;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  uint64_t mse_mod;
  uint64_t mse_ref;
  RegisterStateCheckMMX reg_check_mmx;
  AssertHelper local_38;
  
  mse_ref = 0;
  mse_mod = 0;
  dstride = (this->super_Mse16xHTest).params_.width;
  h = (this->super_Mse16xHTest).params_.height;
  this_00 = &(this->super_Mse16xHTest).rnd_;
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    for (lVar6 = 0; lVar6 < (this->super_Mse16xHTest).mem_size; lVar6 = lVar6 + 1) {
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      (this->super_Mse16xHTest).dst_[lVar6] = uVar2;
      uVar3 = libaom_test::ACMRandom::Rand16(this_00);
      uVar5 = uVar3 >> 6;
      if (0x3fff < uVar3) {
        uVar5 = 0x4000;
      }
      (this->super_Mse16xHTest).src_[lVar6] = uVar5;
    }
    reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    mse_ref = aom_mse_16xh_16bit_c
                        ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,
                         dstride,h);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
    reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord;
    reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
    mse_mod = (*(this->super_Mse16xHTest).params_.func)
                        ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,
                         dstride,h);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&reg_check_mmx,"mse_ref","mse_mod",&mse_ref,&mse_mod);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_78);
      std::operator<<((ostream *)(local_78._M_head_impl + 0x10),"ref mse: ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_78._M_head_impl + 0x10));
      std::operator<<((ostream *)(local_78._M_head_impl + 0x10)," mod mse: ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_78._M_head_impl + 0x10));
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      message = "";
      if (puVar1 != (undefined8 *)0x0) {
        message = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x238,(char *)message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
  }
  return;
}

Assistant:

TEST_P(Mse16xHTest, RefMse) { RefMatchTestMse(); }